

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

void __thiscall
eastl::vector<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>::
DoInsertValue(vector<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
              *this,iterator position,value_type *value)

{
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> **pppVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  uint uVar4;
  uint uVar5;
  value_type *pvVar6;
  value_type *pvVar7;
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> *ppVar8;
  pair<char,_eastl::basic_string<char,_eastl::allocator>_> *ppVar9;
  long lVar10;
  int iVar11;
  iterator ppVar12;
  generic_iterator<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>_*,_void>
  currentDest;
  size_t sVar13;
  
  pvVar2 = (this->
           super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
           ).mpEnd;
  if (pvVar2 == (this->
                super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                ).mpCapacity) {
    ppVar12 = (this->
              super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
              ).mpBegin;
    iVar11 = (int)((ulong)((long)pvVar2 - (long)ppVar12) >> 3);
    uVar4 = 1;
    if (iVar11 * -0x33333333 != 0) {
      uVar4 = iVar11 * -0x66666666;
    }
    if (uVar4 == 0) {
      ppVar8 = (pair<char,_eastl::basic_string<char,_eastl::allocator>_> *)0x0;
      ppVar9 = ppVar8;
    }
    else {
      ppVar8 = (pair<char,_eastl::basic_string<char,_eastl::allocator>_> *)
               malloc((ulong)uVar4 * 0x28);
      ppVar9 = ppVar8;
    }
    for (; ppVar12 != position; ppVar12 = ppVar12 + 1) {
      ppVar8->first = ppVar12->first;
      (ppVar8->second).mpBegin = (ppVar12->second).mpBegin;
      (ppVar12->second).mpBegin = (value_type *)0x0;
      (ppVar8->second).mpEnd = (ppVar12->second).mpEnd;
      (ppVar12->second).mpEnd = (value_type *)0x0;
      (ppVar8->second).mpCapacity = (ppVar12->second).mpCapacity;
      (ppVar12->second).mpCapacity = (value_type *)0x0;
      ppVar8 = ppVar8 + 1;
    }
    ppVar8->first = value->first;
    (ppVar8->second).mpBegin = (value_type *)0x0;
    (ppVar8->second).mpEnd = (value_type *)0x0;
    (ppVar8->second).mpCapacity = (value_type *)0x0;
    pvVar3 = (value->second).mpBegin;
    sVar13 = (long)(value->second).mpEnd - (long)pvVar3;
    uVar5 = (int)sVar13 + 1;
    if (uVar5 < 2) {
      pvVar6 = &gEmptyString;
      pvVar7 = &DAT_0010908d;
    }
    else {
      pvVar6 = (value_type *)malloc((ulong)uVar5);
      pvVar7 = pvVar6 + uVar5;
    }
    (ppVar8->second).mpBegin = pvVar6;
    (ppVar8->second).mpEnd = pvVar6;
    (ppVar8->second).mpCapacity = pvVar7;
    memmove(pvVar6,pvVar3,sVar13);
    (ppVar8->second).mpEnd = pvVar6 + sVar13;
    pvVar6[sVar13] = '\0';
    ppVar12 = (this->
              super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
              ).mpEnd;
    ppVar8 = ppVar8 + 1;
    if (ppVar12 != position) {
      do {
        ppVar8->first = position->first;
        (ppVar8->second).mpBegin = (value_type *)0x0;
        (ppVar8->second).mpEnd = (value_type *)0x0;
        (ppVar8->second).mpCapacity = (value_type *)0x0;
        (ppVar8->second).mpBegin = (position->second).mpBegin;
        (position->second).mpBegin = (value_type *)0x0;
        pvVar3 = (ppVar8->second).mpEnd;
        (ppVar8->second).mpEnd = (position->second).mpEnd;
        (position->second).mpEnd = pvVar3;
        pvVar3 = (ppVar8->second).mpCapacity;
        (ppVar8->second).mpCapacity = (position->second).mpCapacity;
        (position->second).mpCapacity = pvVar3;
        position = position + 1;
        ppVar8 = ppVar8 + 1;
      } while (position != ppVar12);
      position = (this->
                 super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                 ).mpEnd;
    }
    ppVar12 = (this->
              super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
              ).mpBegin;
    if (ppVar12 < position) {
      do {
        pvVar3 = (ppVar12->second).mpBegin;
        if ((pvVar3 != (value_type *)0x0) && (1 < (long)(ppVar12->second).mpCapacity - (long)pvVar3)
           ) {
          operator_delete__(pvVar3);
        }
        ppVar12 = ppVar12 + 1;
      } while (ppVar12 < position);
      ppVar12 = (this->
                super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
                ).mpBegin;
    }
    if (ppVar12 != (iterator)0x0) {
      operator_delete__(ppVar12);
    }
    (this->
    super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
    ).mpBegin = ppVar9;
    (this->
    super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
    ).mpEnd = ppVar8;
    (this->
    super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
    ).mpCapacity = ppVar9 + uVar4;
  }
  else {
    lVar10 = 0x28;
    if (pvVar2 <= value) {
      lVar10 = 0;
    }
    if (value < position) {
      lVar10 = 0;
    }
    ppVar12 = (iterator)(&value->first + lVar10);
    pvVar2->first = pvVar2[-1].first;
    pvVar3 = pvVar2[-1].second.mpBegin;
    sVar13 = (long)pvVar2[-1].second.mpEnd - (long)pvVar3;
    uVar4 = (int)sVar13 + 1;
    if (uVar4 < 2) {
      pvVar6 = &gEmptyString;
      pvVar7 = &DAT_0010908d;
    }
    else {
      pvVar6 = (value_type *)malloc((ulong)uVar4);
      pvVar7 = pvVar6 + uVar4;
    }
    (pvVar2->second).mpBegin = pvVar6;
    (pvVar2->second).mpEnd = pvVar6;
    (pvVar2->second).mpCapacity = pvVar7;
    memmove(pvVar6,pvVar3,sVar13);
    (pvVar2->second).mpEnd = pvVar6 + sVar13;
    pvVar6[sVar13] = '\0';
    ppVar8 = (this->
             super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
             ).mpEnd;
    copy_backward_impl<false,std::random_access_iterator_tag>::
    do_copy<eastl::pair<char,eastl::basic_string<char,eastl::allocator>>*,eastl::pair<char,eastl::basic_string<char,eastl::allocator>>*>
              (position,ppVar8 + -1,ppVar8);
    position->first = ppVar12->first;
    if (ppVar12 != position) {
      basic_string<char,_eastl::allocator>::assign
                (&position->second,(ppVar12->second).mpBegin,(ppVar12->second).mpEnd);
    }
    pppVar1 = &(this->
               super_VectorBase<eastl::pair<char,_eastl::basic_string<char,_eastl::allocator>_>,_eastl::allocator>
               ).mpEnd;
    *pppVar1 = *pppVar1 + 1;
  }
  return;
}

Assistant:

void vector<T, Allocator>::DoInsertValue(iterator position, const value_type& value)
    {
#if EASTL_ASSERT_ENABLED
            if(EASTL_UNLIKELY((position < mpBegin) || (position > mpEnd)))
                EASTL_FAIL_MSG("vector::insert -- invalid position");
#endif

        if(mpEnd != mpCapacity) // If size < capacity ...
        {
            // EASTL_ASSERT(position < mpEnd); // We don't call this function unless position is less than end, and the code directly below relies on this.
            // We need to take into account the possibility that value may come from within the vector itself.
            const T* pValue = &value;
            if((pValue >= position) && (pValue < mpEnd)) // If value comes from within the range to be moved...
                ++pValue;
            ::new(mpEnd) value_type(*(mpEnd - 1));
            eastl::copy_backward(position, mpEnd - 1, mpEnd); // We need copy_backward because of potential overlap issues.
            *position = *pValue;
            ++mpEnd;
        }
        else // else (size == capacity)
        {
            const size_type nPrevSize = size_type(mpEnd - mpBegin);
            const size_type nNewSize  = GetNewCapacity(nPrevSize);
            pointer const   pNewData  = DoAllocate(nNewSize);

#if EASTL_EXCEPTIONS_ENABLED
                pointer pNewEnd = pNewData;
                try
                {
                    pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                    ::new(pNewEnd) value_type(value);
                    pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
                }
                catch(...)
                {
                    DoDestroyValues(pNewData, pNewEnd);
                    DoFree(pNewData, nNewSize);
                    throw;
                }
#else
                pointer pNewEnd = eastl::uninitialized_copy_ptr(mpBegin, position, pNewData);
                ::new(pNewEnd) value_type(value);
                pNewEnd = eastl::uninitialized_copy_ptr(position, mpEnd, ++pNewEnd);
#endif

            DoDestroyValues(mpBegin, mpEnd);
            DoFree(mpBegin, (size_type)(mpCapacity - mpBegin));

            mpBegin    = pNewData;
            mpEnd      = pNewEnd;
            mpCapacity = pNewData + nNewSize;
        }
    }